

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsEarlyFragmentTests.cpp
# Opt level: O1

TestCaseGroup * vkt::FragmentOperations::createEarlyFragmentTests(TestContext *testCtx)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  TestNode *this;
  TestNode *node;
  long lVar4;
  long *local_70 [2];
  long local_60 [2];
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"early_fragment","early fragment test cases");
  if (createEarlyFragmentTests(tcu::TestContext&)::cases == '\0') {
    iVar3 = __cxa_guard_acquire(&createEarlyFragmentTests(tcu::TestContext&)::cases);
    if (iVar3 != 0) {
      createEarlyFragmentTests::cases[0].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[0].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)createEarlyFragmentTests::cases,"no_early_fragment_tests_depth","");
      createEarlyFragmentTests::cases[0].flags = 9;
      createEarlyFragmentTests::cases[1].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[1].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(createEarlyFragmentTests::cases + 1),"no_early_fragment_tests_stencil",
                 "");
      createEarlyFragmentTests::cases[1].flags = 10;
      createEarlyFragmentTests::cases[2].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[2].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(createEarlyFragmentTests::cases + 2),"early_fragment_tests_depth","");
      createEarlyFragmentTests::cases[2].flags = 1;
      createEarlyFragmentTests::cases[3].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[3].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(createEarlyFragmentTests::cases + 3),"early_fragment_tests_stencil","");
      createEarlyFragmentTests::cases[3].flags = 2;
      createEarlyFragmentTests::cases[4].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[4].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(createEarlyFragmentTests::cases + 4),
                 "no_early_fragment_tests_depth_no_attachment","");
      createEarlyFragmentTests::cases[4].flags = 0xd;
      createEarlyFragmentTests::cases[5].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[5].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(createEarlyFragmentTests::cases + 5),
                 "no_early_fragment_tests_stencil_no_attachment","");
      createEarlyFragmentTests::cases[5].flags = 0xe;
      createEarlyFragmentTests::cases[6].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[6].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(createEarlyFragmentTests::cases + 6),
                 "early_fragment_tests_depth_no_attachment","");
      createEarlyFragmentTests::cases[6].flags = 5;
      createEarlyFragmentTests::cases[7].caseName._M_dataplus._M_p =
           (pointer)&createEarlyFragmentTests::cases[7].caseName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(createEarlyFragmentTests::cases + 7),
                 "early_fragment_tests_stencil_no_attachment","");
      createEarlyFragmentTests::cases[7].flags = 6;
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createEarlyFragmentTests(tcu::TestContext&)::cases);
    }
  }
  lVar4 = 0;
  do {
    node = (TestNode *)operator_new(0x78);
    lVar2 = *(long *)((long)&createEarlyFragmentTests::cases[0].caseName._M_dataplus._M_p + lVar4);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,lVar2,
               *(long *)((long)&createEarlyFragmentTests::cases[0].caseName._M_string_length + lVar4
                        ) + lVar2);
    uVar1 = *(undefined4 *)((long)&createEarlyFragmentTests::cases[0].flags + lVar4);
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    tcu::TestCase::TestCase((TestCase *)node,testCtx,(char *)local_70[0],&local_40);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1aed0;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d31430;
    *(undefined4 *)&node[1]._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(this,node);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x140);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createEarlyFragmentTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "early_fragment", "early fragment test cases"));

	static const struct
	{
		std::string caseName;
		deUint32	flags;
	} cases[] =
	{
		{ "no_early_fragment_tests_depth",					FLAG_TEST_DEPTH   | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS									},
		{ "no_early_fragment_tests_stencil",				FLAG_TEST_STENCIL | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS									},
		{ "early_fragment_tests_depth",						FLAG_TEST_DEPTH																			},
		{ "early_fragment_tests_stencil",					FLAG_TEST_STENCIL																		},
		{ "no_early_fragment_tests_depth_no_attachment",	FLAG_TEST_DEPTH   | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS | FLAG_DONT_USE_TEST_ATTACHMENT	},
		{ "no_early_fragment_tests_stencil_no_attachment",	FLAG_TEST_STENCIL | FLAG_DONT_USE_EARLY_FRAGMENT_TESTS | FLAG_DONT_USE_TEST_ATTACHMENT	},
		{ "early_fragment_tests_depth_no_attachment",		FLAG_TEST_DEPTH   |										 FLAG_DONT_USE_TEST_ATTACHMENT  },
		{ "early_fragment_tests_stencil_no_attachment",		FLAG_TEST_STENCIL |										 FLAG_DONT_USE_TEST_ATTACHMENT	},
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(cases); ++i)
		testGroup->addChild(new EarlyFragmentTest(testCtx, cases[i].caseName, cases[i].flags));

	return testGroup.release();
}